

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

int32_t adt_utf8_readCodePoint(uint8_t *strBuf,int32_t bufLen,int *codePoint)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  int iVar8;
  
  if ((codePoint == (int *)0x0 || strBuf == (uint8_t *)0x0) || bufLen < 0) {
    return -1;
  }
  bVar1 = *strBuf;
  uVar6 = (uint)bVar1;
  iVar8 = 1;
  bVar2 = 1;
  if ((char)bVar1 < '\0') {
    uVar6 = (uint)bVar1;
    if ((bVar1 & 0xe0) == 0xc0) {
      uVar6 = uVar6 & 0x1f;
      iVar8 = 2;
    }
    else if ((bVar1 & 0xf0) == 0xe0) {
      uVar6 = uVar6 & 0xf;
      iVar8 = 3;
    }
    else {
      if ((bVar1 & 0xf8) != 0xf0) {
        iVar4 = -2;
        uVar6 = 0;
        bVar3 = false;
        iVar8 = 0;
        goto LAB_00108205;
      }
      uVar6 = uVar6 & 7;
      iVar8 = 4;
    }
    iVar4 = 0;
    bVar3 = true;
    bVar2 = 0;
  }
  else {
    iVar4 = 0;
    bVar3 = true;
  }
LAB_00108205:
  iVar5 = 0;
  if (bVar3) {
    iVar5 = iVar4;
    if (iVar8 <= bufLen) {
      iVar5 = iVar8;
    }
    if (!(bool)(bufLen < iVar8 | bVar2)) {
      iVar4 = iVar8 + 1;
      pbVar7 = strBuf + 1;
      do {
        if ((*pbVar7 & 0xffffffc0) != 0x80) {
          iVar5 = -2;
          break;
        }
        uVar6 = *pbVar7 & 0x3f | uVar6 << 6;
        iVar4 = iVar4 + -1;
        pbVar7 = pbVar7 + 1;
        iVar5 = iVar8;
      } while (2 < iVar4);
    }
  }
  if (0 < iVar5) {
    *codePoint = uVar6;
  }
  return iVar5;
}

Assistant:

DYN_STATIC int32_t adt_utf8_readCodePoint(const uint8_t *strBuf, int32_t bufLen, int *codePoint)
{
   int tmp = 0;
   int32_t retval = 0;
   if ( (strBuf == 0) || (bufLen < 0) || (codePoint == 0) )
   {
      return ADT_UTF8_INVALID_ARGUMENT;
   }
   if (bufLen > 0)
   {
      int32_t expectedLen = 0;
      uint8_t c = (uint8_t) *strBuf++;
      if (c < 128u)
      {
         expectedLen = 1;
         tmp = c;
      }
      else if ( ( (c & 0xe0) == 0xc0) )
      {
         expectedLen = 2;
         tmp = c & 0x1F;

      }
      else if ( ( (c & 0xf0) == 0xe0) )
      {
         expectedLen = 3;
         tmp = c & 0x0F;
      }
      else if ( ( (c & 0xf8) == 0xf0) )
      {
         expectedLen = 4;
         tmp = c & 0x07;
      }
      else
      {
         retval = ADT_UTF8_INVALID_ENCODING;
      }
      if ( expectedLen > 0 )
      {
         if (bufLen >= expectedLen)
         {
            retval = expectedLen--;
            while(expectedLen > 0)
            {
               c = (uint8_t) *strBuf++;
               if ( ( (c & 0xc0) != 0x80) )
               {
                  retval = ADT_UTF8_INVALID_ENCODING;
                  break;
               }
               tmp <<= 6;
               tmp |= c & 0x3F;
               --expectedLen;
            }
         }
      }
      else
      {
         retval = 0; //not enough bytes in buffer, try again later
      }
   }
   if (retval > 0)
   {
      *codePoint = tmp;
   }
   return retval;
}